

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O3

char * Abc_SopDecoderPos(Mem_Flex_t *pMan,int nValues)

{
  size_t sVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int Num;
  Vec_Str_t *p;
  char *pcVar5;
  char *pcVar6;
  int i;
  long lVar7;
  
  if (nValues < 2) {
    __assert_fail("nValues > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcSop.c"
                  ,0x475,"char *Abc_SopDecoderPos(Mem_Flex_t *, int)");
  }
  p = (Vec_Str_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  pcVar5 = (char *)malloc(100);
  p->pArray = pcVar5;
  Num = 0;
  do {
    iVar4 = 0;
    do {
      if (iVar4 == Num) {
        lVar7 = 0;
        do {
          cVar2 = "X9K 6TX9( 6+T9X 6Xj9( :X6+j Xj(9Tn s:X6+ 9Gn G&6X 9H6X Ga9n 1G9n :Gn 6HX91 "
                  [lVar7 + 0x49];
          uVar3 = p->nSize;
          if (uVar3 == p->nCap) {
            if ((int)uVar3 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar5;
              p->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar3 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar1);
              }
              else {
                pcVar5 = (char *)realloc(p->pArray,sVar1);
              }
              p->pArray = pcVar5;
              p->nCap = (int)sVar1;
            }
          }
          else {
            pcVar5 = p->pArray;
          }
          p->nSize = uVar3 + 1;
          pcVar5[(int)uVar3] = cVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
      }
      else {
        lVar7 = 0;
        do {
          cVar2 = "    - "[lVar7 + 4];
          uVar3 = p->nSize;
          if (uVar3 == p->nCap) {
            if ((int)uVar3 < 0x10) {
              if (p->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(p->pArray,0x10);
              }
              p->pArray = pcVar5;
              p->nCap = 0x10;
            }
            else {
              sVar1 = (ulong)uVar3 * 2;
              if (p->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar1);
              }
              else {
                pcVar5 = (char *)realloc(p->pArray,sVar1);
              }
              p->pArray = pcVar5;
              p->nCap = (int)sVar1;
            }
          }
          else {
            pcVar5 = p->pArray;
          }
          p->nSize = uVar3 + 1;
          pcVar5[(int)uVar3] = cVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 2);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != nValues);
    Vec_StrPrintNum(p,Num);
    uVar3 = p->nSize;
    if (uVar3 == p->nCap) {
      if ((int)uVar3 < 0x10) {
        if (p->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(p->pArray,0x10);
        }
        p->pArray = pcVar5;
        p->nCap = 0x10;
      }
      else {
        sVar1 = (ulong)uVar3 * 2;
        if (p->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar1);
        }
        else {
          pcVar5 = (char *)realloc(p->pArray,sVar1);
        }
        p->pArray = pcVar5;
        p->nCap = (int)sVar1;
      }
    }
    else {
      pcVar5 = p->pArray;
    }
    p->nSize = uVar3 + 1;
    pcVar5[(int)uVar3] = '\n';
    Num = Num + 1;
  } while (Num != nValues);
  uVar3 = p->nSize;
  if (uVar3 == p->nCap) {
    if ((int)uVar3 < 0x10) {
      if (p->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(p->pArray,0x10);
      }
      p->pArray = pcVar5;
      p->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar3 * 2;
      if (p->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar1);
      }
      else {
        pcVar5 = (char *)realloc(p->pArray,sVar1);
      }
      p->pArray = pcVar5;
      p->nCap = (int)sVar1;
    }
  }
  else {
    pcVar5 = p->pArray;
  }
  p->nSize = uVar3 + 1;
  pcVar5[(int)uVar3] = '\0';
  pcVar5 = p->pArray;
  pcVar6 = Abc_SopRegister(pMan,pcVar5);
  if (pcVar5 != (char *)0x0) {
    free(pcVar5);
  }
  free(p);
  return pcVar6;
}

Assistant:

char * Abc_SopDecoderPos( Mem_Flex_t * pMan, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int i, k;
    assert( nValues > 1 );
    vSop = Vec_StrAlloc( 100 );
    for ( i = 0; i < nValues; i++ )
    {
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == i )
                Vec_StrPrintStr( vSop, "1 " );
            else
                Vec_StrPrintStr( vSop, "- " );
        }
        Vec_StrPrintNum( vSop, i );
        Vec_StrPush( vSop, '\n' );
    }
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}